

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_test.c
# Opt level: O0

void test_cv_cancel(testing t)

{
  uint uVar1;
  int iVar2;
  nsync_note cancel_note;
  char *pcVar3;
  char *pcVar4;
  nsync_time b;
  nsync_time b_00;
  nsync_time nVar5;
  nsync_time nVar6;
  nsync_time nVar7;
  nsync_time nVar8;
  char *elapsed_str_1;
  char *elapsed_str;
  nsync_time expected_end_time;
  nsync_time start_time;
  nsync_time end_time;
  nsync_note cancel;
  int x;
  nsync_time too_late;
  nsync_time too_early;
  undefined1 local_48 [4];
  int i;
  nsync_cv cv;
  nsync_mu mu;
  int too_late_violations;
  nsync_time future_time;
  testing t_local;
  
  nsync_mu_init((nsync_mu *)&cv.waiters);
  nsync_cv_init((nsync_cv *)local_48);
  b = nsync_time_ms(1);
  b_00 = nsync_time_ms(100);
  nVar5 = nsync_time_now();
  nVar6 = nsync_time_ms(3600000);
  nVar5 = nsync_time_add(nVar5,nVar6);
  mu.waiters._4_4_ = 0;
  nsync_mu_lock((nsync_mu *)&cv.waiters);
  for (too_early.tv_nsec._4_4_ = 0; too_early.tv_nsec._4_4_ != 0x32;
      too_early.tv_nsec._4_4_ = too_early.tv_nsec._4_4_ + 1) {
    nVar6 = nsync_time_now();
    nVar7 = nsync_time_ms(0x57);
    nVar6 = nsync_time_add(nVar6,nVar7);
    cancel_note = nsync_note_new((nsync_note)0x0,nVar6);
    uVar1 = nsync_cv_wait_with_deadline
                      ((nsync_cv *)local_48,(nsync_mu *)&cv.waiters,nVar5,cancel_note);
    if (uVar1 != 0x7d) {
      pcVar3 = smprintf("nsync_cv_wait() returned non-cancelled (%d) for a cancellation; expected %d"
                        ,(ulong)uVar1,0x7d);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x11e,pcVar3);
    }
    nVar7 = nsync_time_now();
    nVar8 = nsync_time_sub(nVar6,b);
    iVar2 = nsync_time_cmp(nVar7,nVar8);
    if (iVar2 < 0) {
      nVar8 = nsync_time_sub(nVar6,nVar7);
      pcVar3 = nsync_time_str(nVar8,2);
      pcVar4 = smprintf("nsync_cv_wait() returned %s too early",pcVar3);
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x123,pcVar4);
      free(pcVar3);
    }
    nVar8 = nsync_time_add(nVar6,b_00);
    iVar2 = nsync_time_cmp(nVar8,nVar7);
    if (iVar2 < 0) {
      mu.waiters._4_4_ = mu.waiters._4_4_ + 1;
    }
    nVar7 = nsync_time_now();
    nVar8.tv_nsec = 999999999;
    nVar8.tv_sec = 0x7fffffffffffffff;
    uVar1 = nsync_cv_wait_with_deadline
                      ((nsync_cv *)local_48,(nsync_mu *)&cv.waiters,nVar8,cancel_note);
    if (uVar1 != 0x7d) {
      pcVar3 = smprintf("nsync_cv_wait() returned non-cancelled (%d) for a cancellation; expected %d"
                        ,(ulong)uVar1,0x7d);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x131,pcVar3);
    }
    nVar8 = nsync_time_now();
    iVar2 = nsync_time_cmp(nVar8,nVar7);
    if (iVar2 < 0) {
      nVar6 = nsync_time_sub(nVar6,nVar8);
      pcVar3 = nsync_time_str(nVar6,2);
      pcVar4 = smprintf("nsync_cv_wait() returned %s too early",pcVar3);
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x136,pcVar4);
      free(pcVar3);
    }
    nVar6 = nsync_time_add(nVar7,b_00);
    iVar2 = nsync_time_cmp(nVar6,nVar8);
    if (iVar2 < 0) {
      mu.waiters._4_4_ = mu.waiters._4_4_ + 1;
    }
    nsync_note_notify(cancel_note);
    nsync_note_free(cancel_note);
  }
  nsync_mu_unlock((nsync_mu *)&cv.waiters);
  if (0x19 < (int)mu.waiters._4_4_) {
    pcVar3 = smprintf("nsync_cv_wait() returned too late %d times",(ulong)mu.waiters._4_4_);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                   ,0x142,pcVar3);
  }
  return;
}

Assistant:

static void test_cv_cancel (testing t) {
	nsync_time future_time;
	int too_late_violations;
	nsync_mu mu;
	nsync_cv cv;
	int i;
	nsync_time too_early;
	nsync_time too_late;

	nsync_mu_init (&mu);
	nsync_cv_init (&cv);
	too_early = nsync_time_ms (TOO_EARLY_MS);
	too_late = nsync_time_ms (TOO_LATE_MS);

	/* The loops below cancel after 87 milliseconds, like the timeout tests above. */

	future_time = nsync_time_add (nsync_time_now (), nsync_time_ms (3600000)); /* test cancels with timeout */

	too_late_violations = 0;
	nsync_mu_lock (&mu);
	for (i = 0; i != 50; i++) {
		int x;
		nsync_note cancel;
		nsync_time end_time;
		nsync_time start_time;
		nsync_time expected_end_time;
		start_time = nsync_time_now ();
		expected_end_time = nsync_time_add (start_time, nsync_time_ms (87));

		cancel = nsync_note_new (NULL, expected_end_time);

		x = nsync_cv_wait_with_deadline (&cv, &mu, future_time, cancel);
		if (x != ECANCELED) {
			TEST_FATAL (t, ("nsync_cv_wait() returned non-cancelled (%d) for "
				   "a cancellation; expected %d",
				   x, ECANCELED));
		}
		end_time = nsync_time_now ();
		if (nsync_time_cmp (end_time, nsync_time_sub (expected_end_time, too_early)) < 0) {
			char *elapsed_str = nsync_time_str (nsync_time_sub (expected_end_time, end_time), 2);
			TEST_ERROR (t, ("nsync_cv_wait() returned %s too early", elapsed_str));
			free (elapsed_str);
		}
		if (nsync_time_cmp (nsync_time_add (expected_end_time, too_late), end_time) < 0) {
			too_late_violations++;
		}

		/* Check that an already cancelled wait returns immediately. */
		start_time = nsync_time_now ();

		x = nsync_cv_wait_with_deadline (&cv, &mu, nsync_time_no_deadline, cancel);
		if (x != ECANCELED) {
			TEST_FATAL (t, ("nsync_cv_wait() returned non-cancelled (%d) for "
				   "a cancellation; expected %d",
				   x, ECANCELED));
		}
		end_time = nsync_time_now ();
		if (nsync_time_cmp (end_time, start_time) < 0) {
			char *elapsed_str = nsync_time_str (nsync_time_sub (expected_end_time, end_time), 2);
			TEST_ERROR (t, ("nsync_cv_wait() returned %s too early", elapsed_str));
			free (elapsed_str);
		}
		if (nsync_time_cmp (nsync_time_add (start_time, too_late), end_time) < 0) {
			too_late_violations++;
		}
		nsync_note_notify (cancel);

		nsync_note_free (cancel);
	}
	nsync_mu_unlock (&mu);
	if (too_late_violations > TOO_LATE_ALLOWED) {
		TEST_ERROR (t, ("nsync_cv_wait() returned too late %d times", too_late_violations));
	}
}